

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::ComputeBuildFileGenerators(cmGlobalGenerator *this)

{
  cmExportBuildFileGenerator *this_00;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppcVar4;
  reference ppcVar5;
  reference ppcVar6;
  cmExportBuildFileGenerator *g;
  iterator __end2;
  iterator __begin2;
  vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> *__range2;
  vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> gens;
  uint i;
  cmGlobalGenerator *this_local;
  
  gens.
  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)gens.
                   super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    if (sVar3 <= uVar2) break;
    ppcVar4 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,
                         (ulong)gens.
                                super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    cmMakefile::GetExportBuildFileGenerators
              ((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                *)&__range2,*ppcVar4);
    __end2 = std::
             vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
             begin((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                    *)&__range2);
    g = (cmExportBuildFileGenerator *)
        std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
        end((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> *)
            &__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
                                  *)&g);
      if (!bVar1) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
                ::operator*(&__end2);
      this_00 = *ppcVar5;
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,
                           (ulong)gens.
                                  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      cmExportBuildFileGenerator::Compute(this_00,*ppcVar6);
      __gnu_cxx::
      __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
    ~vector((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> *)
            &__range2);
    gens.
    super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         gens.
         super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::ComputeBuildFileGenerators()
{
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    std::vector<cmExportBuildFileGenerator*> gens =
      this->Makefiles[i]->GetExportBuildFileGenerators();
    for (cmExportBuildFileGenerator* g : gens) {
      g->Compute(this->LocalGenerators[i]);
    }
  }
}